

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O1

string * __thiscall cm::String::str_abi_cxx11_(String *this)

{
  pointer pcVar1;
  string *psVar2;
  undefined1 *puVar3;
  
  pcVar1 = (this->view_)._M_str;
  if (pcVar1 == (pointer)0x0) {
    puVar3 = empty_string__abi_cxx11_;
  }
  else {
    psVar2 = (this->string_).
             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((psVar2 == (string *)0x0) || (pcVar1 != (psVar2->_M_dataplus)._M_p)) {
      puVar3 = (undefined1 *)(string *)0x0;
    }
    else {
      puVar3 = (undefined1 *)(string *)0x0;
      if ((this->view_)._M_len == psVar2->_M_string_length) {
        puVar3 = (undefined1 *)psVar2;
      }
    }
  }
  if ((string *)puVar3 == (string *)0x0) {
    internally_mutate_to_stable_string(this);
    puVar3 = (undefined1 *)
             (this->string_).
             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  return (string *)puVar3;
}

Assistant:

std::string const& String::str()
{
  if (std::string const* s = this->str_if_stable()) {
    return *s;
  }
  // Mutate to hold a std::string that is stable for the lifetime
  // of our current value.
  this->internally_mutate_to_stable_string();
  return *this->string_;
}